

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::GenDartTypeName
          (string *__return_storage_ptr__,DartGenerator *this,Type *type,
          Namespace *current_namespace,FieldDef *def,bool nullable,string *struct_type_suffix)

{
  bool bVar1;
  string local_58;
  undefined1 local_32;
  byte local_31;
  FieldDef *pFStack_30;
  bool nullable_local;
  FieldDef *def_local;
  Namespace *current_namespace_local;
  Type *type_local;
  DartGenerator *this_local;
  string *typeName;
  
  local_32 = 0;
  local_31 = nullable;
  pFStack_30 = def;
  def_local = (FieldDef *)current_namespace;
  current_namespace_local = (Namespace *)type;
  type_local = (Type *)this;
  this_local = (DartGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_58,(string *)struct_type_suffix);
  GenDartTypeName(__return_storage_ptr__,this,type,current_namespace,def,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (((local_31 & 1) != 0) && (bVar1 = std::operator!=(__return_storage_ptr__,"dynamic"), bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"?");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDartTypeName(const Type &type, Namespace *current_namespace,
                              const FieldDef &def, bool nullable,
                              std::string struct_type_suffix) {
    std::string typeName =
        GenDartTypeName(type, current_namespace, def, struct_type_suffix);
    if (nullable && typeName != "dynamic") typeName += "?";
    return typeName;
  }